

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  undefined1 uVar2;
  pointer ppcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte *pbVar12;
  Source *pSVar13;
  Lexem *pLVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar15;
  bool *args_2;
  size_t __nbytes;
  int extraout_EDX;
  uint extraout_EDX_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX_18;
  void *extraout_RDX_19;
  void *extraout_RDX_20;
  void *extraout_RDX_21;
  void *__buf_02;
  uint uVar16;
  char **args;
  undefined1 uVar17;
  char *pcVar18;
  char *pcVar19;
  uint uVar20;
  undefined1 uVar21;
  string *str;
  ulong uVar22;
  char **local_ee8;
  uint local_ebc;
  char *local_eb8;
  char *local_eb0;
  char *local_ea8;
  allocator local_e99;
  ulong local_e98;
  undefined8 local_e90;
  Vec<const_char_*> lfc;
  Pool<Hpipe::Source,_32> source_pool;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> lfs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  disp;
  StreamSepMaker ss;
  string local_d80;
  string local_d60;
  string local_d40;
  undefined1 local_d20 [48];
  int tmp;
  pointer local_ce8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce0 [31];
  undefined1 local_af0 [8];
  _Alloc_hider local_ae8;
  size_type local_ae0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad8;
  bool local_ac8;
  CppEmitter ce;
  Lexer lexer;
  ErrorList error_list;
  StreamSep local_810;
  StreamSep local_7c8;
  StreamSep local_780;
  StreamSep local_738;
  StreamSep local_6f0;
  StreamSep local_6a8;
  StreamSep local_660;
  StreamSep local_618;
  StreamSep local_5d0;
  StreamSep local_588;
  StreamSep local_540;
  InstructionGraph ig;
  CharGraph cg;
  istringstream iss;
  
  uVar22 = 1;
  local_eb0 = "HPIPE_BUFFER";
  uVar21 = false;
  local_e98 = 0;
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  bVar8 = false;
  local_eb8 = (char *)0x0;
  local_ebc = 0;
  local_ee8 = (char **)0x1;
  local_e90 = 0;
  local_ea8 = "";
  uVar17 = false;
  uVar2 = false;
  iVar11 = 0;
LAB_0013c0fa:
  iVar9 = (int)uVar22;
  uVar16 = (uint)local_ee8;
  if ((int)uVar16 < argc) {
    pcVar19 = argv[(int)uVar16];
    if (*pcVar19 != '-') goto LAB_0013c6ba;
    bVar1 = pcVar19[1];
    if (bVar1 != 0x2d) {
LAB_0013c44d:
      pbVar12 = (byte *)(pcVar19 + 2);
      bVar4 = false;
      uVar22 = (ulong)(uint)bVar1;
      do {
        iVar9 = (int)uVar22;
        if ((char)uVar22 == 'b') {
          local_e98 = 1;
        }
        else if (iVar9 == 0x74) {
          uVar21 = true;
        }
        else if (iVar9 != 0x66) {
          if (iVar9 == 0x6c) {
            uVar2 = true;
          }
          else if (iVar9 == 0x70) {
            local_e90 = 1;
          }
          else {
            if (iVar9 != 99) goto LAB_0013c4a3;
            uVar17 = true;
          }
        }
        uVar22 = (ulong)*pbVar12;
        pbVar12 = pbVar12 + 1;
        bVar4 = true;
      } while( true );
    }
    pcVar18 = pcVar19 + 2;
    iVar9 = _preparg_streq_u2m(pcVar18,"disp_lexem_graph");
    if (iVar9 == 0) {
      iVar9 = _preparg_streq_u2m(pcVar18,"disp_char_graph");
      if (iVar9 != 0) {
        uVar17 = true;
        uVar22 = extraout_RDX_00;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"disp_inst_graph");
      uVar22 = extraout_RDX_01;
      if (iVar9 != 0) goto joined_r0x0013c18f;
      iVar9 = _preparg_streq_u2m(pcVar18,"disp_inst_pred");
      if (iVar9 != 0) {
        local_e90 = CONCAT71((int7)(CONCAT44(extraout_var,iVar9) >> 8),1);
        uVar22 = extraout_RDX_02;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"disp_trans_freq");
      uVar22 = extraout_RDX_03;
      if (iVar9 != 0) goto LAB_0013c4ac;
      iVar9 = _preparg_streq_u2m(pcVar18,"test");
      if (iVar9 != 0) {
        uVar21 = true;
        uVar22 = extraout_RDX_04;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"benchmark");
      if (iVar9 != 0) {
        local_e98 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar9) >> 8),1);
        uVar22 = extraout_RDX_05;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"boyer_moore");
      if (iVar9 != 0) {
        bVar5 = true;
        uVar22 = extraout_RDX_06;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"trace_labels");
      if (iVar9 != 0) {
        bVar6 = true;
        uVar22 = extraout_RDX_07;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"no_training");
      if (iVar9 != 0) {
        bVar7 = true;
        uVar22 = extraout_RDX_08;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"never_ending");
      if (iVar9 != 0) {
        bVar8 = true;
        uVar22 = extraout_RDX_09;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"output");
      if (iVar9 != 0) {
        if (argc <= (int)(uVar16 + 1)) goto LAB_0013cdaa;
        local_eb8 = argv[(int)(uVar16 + 1)];
        uVar22 = extraout_RDX_10;
LAB_0013c2fd:
        uVar16 = uVar16 + 1;
        goto LAB_0013c4ac;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"style");
      if (iVar9 != 0) {
        if (argc <= (int)(uVar16 + 1)) goto LAB_0013ce37;
        local_eb0 = argv[(int)(uVar16 + 1)];
        uVar22 = extraout_RDX_11;
        goto LAB_0013c2fd;
      }
      iVar9 = _preparg_streq_u2m(pcVar18,"stop_char");
      if (iVar9 == 0) {
        iVar9 = _preparg_streq_u2m(pcVar18,"args");
        uVar22 = extraout_RDX_13;
        if (iVar9 != 0) goto joined_r0x0013c508;
        iVar10 = _preparg_streq_u2m(pcVar18,"help");
        iVar9 = extraout_EDX;
        if (iVar10 == 0) goto LAB_0013c44d;
        goto LAB_0013c6a2;
      }
      uVar16 = uVar16 + 1;
      if ((int)uVar16 < argc) {
        bVar4 = _preparg_atoi(&tmp,argv[(int)uVar16]);
        if (!bVar4) {
          local_ee8 = (char **)(ulong)uVar16;
          goto LAB_0013c393;
        }
        local_ebc = tmp;
        iVar9 = 4;
        uVar22 = extraout_RDX_12;
      }
      else {
LAB_0013c393:
        printf("%s","Error: ");
        putchar(0);
        printf("%s"," or --");
        _preparg_dispu("stop_char");
        puts(" must be followed by an integer.\n");
        printf("%s","Try \'");
        printf("%s");
        puts(" --help\' for more information.");
        iVar9 = 1;
        iVar11 = 0x10;
        uVar16 = (uint)local_ee8;
        uVar22 = extraout_RDX_14;
      }
      goto LAB_0013c63f;
    }
    uVar2 = true;
    uVar22 = extraout_RDX;
    goto LAB_0013c4ac;
  }
LAB_0013c77d:
  iVar11 = 2;
  pcVar19 = *argv;
  pcVar18 = "Please specify one or several input file";
LAB_0013c794:
  usage(pcVar19,pcVar18,iVar9);
  return iVar11;
LAB_0013c4a3:
  if (bVar4) goto LAB_0013c4ac;
  if (bVar1 != 0) {
    if (bVar1 != 0x61) {
      if (bVar1 == 0x69) {
        if (pcVar19[2] == '\0') {
joined_r0x0013c18f:
          if (argc <= (int)(uVar16 + 1)) {
            printf("%s","Error: ");
            putchar(0x69);
            printf("%s"," or --");
            _preparg_dispu("disp_inst_graph");
            puts(" must be followed by an argument.\n");
            printf("%s","Try \'");
            pcVar19 = "";
            if (*argv != (char *)0x0) {
              pcVar19 = *argv;
            }
            printf("%s",pcVar19);
            puts(" --help\' for more information.");
            return 5;
          }
          uVar16 = uVar16 + 1;
          local_ea8 = argv[(int)uVar16];
        }
        else {
          local_ea8 = pcVar19 + 2;
        }
        goto LAB_0013c4ac;
      }
      if (bVar1 == 0x6f) {
        if (pcVar19[2] == '\0') {
          uVar16 = uVar16 + 1;
          if (argc <= (int)uVar16) {
LAB_0013cdaa:
            printf("%s","Error: ");
            putchar(0x6f);
            printf("%s"," or --");
            _preparg_dispu("output");
            puts(" must be followed by an argument.\n");
            printf("%s","Try \'");
            pcVar19 = "";
            if (*argv != (char *)0x0) {
              pcVar19 = *argv;
            }
            printf("%s",pcVar19);
            puts(" --help\' for more information.");
            return 0xe;
          }
          local_eb8 = argv[(int)uVar16];
        }
        else {
          local_eb8 = pcVar19 + 2;
        }
        goto LAB_0013c4ac;
      }
      if (bVar1 == 0x73) {
        if (pcVar19[2] == '\0') {
          uVar16 = uVar16 + 1;
          if (argc <= (int)uVar16) {
LAB_0013ce37:
            printf("%s","Error: ");
            putchar(0x73);
            printf("%s"," or --");
            _preparg_dispu("style");
            puts(" must be followed by an argument.\n");
            printf("%s","Try \'");
            pcVar19 = "";
            if (*argv != (char *)0x0) {
              pcVar19 = *argv;
            }
            printf("%s",pcVar19);
            puts(" --help\' for more information.");
            return 0xf;
          }
          local_eb0 = argv[(int)uVar16];
        }
        else {
          local_eb0 = pcVar19 + 2;
        }
        goto LAB_0013c4ac;
      }
      if (bVar1 == 0x68) {
LAB_0013c6a2:
        pcVar19 = *argv;
        iVar11 = 0;
        pcVar18 = (char *)0x0;
        goto LAB_0013c794;
      }
LAB_0013c6ba:
      if ((int)uVar16 < 0) goto LAB_0013c77d;
      Hpipe::ErrorList::ErrorList(&error_list);
      source_pool.last = (Set *)0x0;
      source_pool.used = 0x20;
      Hpipe::Lexer::Lexer(&lexer,&error_list,&source_pool);
      if (!(bool)uVar2) {
        args_2 = (bool *)&tmp;
        _tmp = (char *)((ulong)_tmp & 0xffffffffffffff00);
        pSVar13 = Hpipe::Pool<Hpipe::Source,32>::New<char_const(&)[22],char(&)[6897],bool>
                            ((Pool<Hpipe::Source,32> *)&source_pool,
                             (char (*) [22])"src/Hpipe/predef.sipe",&predef,args_2);
        Hpipe::Lexer::read(&lexer,(int)pSVar13,__buf,(size_t)args_2);
      }
      args = argv + (long)local_ee8;
      for (; (int)local_ee8 < argc; local_ee8 = (char **)(ulong)((int)local_ee8 + 1)) {
        pSVar13 = Hpipe::Pool<Hpipe::Source,32>::New<char*&>
                            ((Pool<Hpipe::Source,32> *)&source_pool,args);
        Hpipe::Lexer::read(&lexer,(int)pSVar13,__buf_00,(size_t)argv);
        args = args + 1;
      }
      if ((bool)uVar2) {
        pLVar14 = Hpipe::Lexer::root(&lexer);
        iVar11 = 0;
        Hpipe::Lexem::display_dot(pLVar14,".res.dot",(char *)0x0);
      }
      else {
        bVar4 = Hpipe::ErrorList::operator_cast_to_bool(&error_list);
        if (bVar4) {
          Hpipe::Lexer::flags_abi_cxx11_(&lfs,&lexer);
          lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          _tmp = "beg_flags section";
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&lfc,(char **)&tmp);
          for (; lfs.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 lfs.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
              lfs.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   lfs.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1) {
            _tmp = ((lfs.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
            std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&lfc,(char **)&tmp);
          }
          local_ee8 = (char **)0x1;
LAB_0013c872:
          ppcVar3 = lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar9 = (int)local_ee8;
          uVar22 = (long)lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (((ulong)(long)iVar9 < uVar22) &&
             (pcVar19 = lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)local_ee8], *pcVar19 == '-')) {
            bVar1 = pcVar19[1];
            if (bVar1 != 0x2d) {
LAB_0013cb00:
              uVar20 = (uint)bVar1;
              pbVar12 = (byte *)(pcVar19 + 2);
              argv = (char **)0x0;
              uVar16 = uVar20;
              do {
                if ((char)uVar16 == 'b') {
                  local_e98 = 1;
                }
                else if (uVar16 == 0x74) {
                  uVar21 = true;
                }
                else if ((uVar16 != 0x66) && (uVar16 != 0x6c)) {
                  if (uVar16 == 0x70) {
                    local_e90 = 1;
                  }
                  else {
                    if (uVar16 != 99) goto LAB_0013cb51;
                    uVar17 = true;
                  }
                }
                uVar16 = (uint)*pbVar12;
                pbVar12 = pbVar12 + 1;
                argv = (char **)0x1;
              } while( true );
            }
            pcVar18 = pcVar19 + 2;
            iVar10 = _preparg_streq_u2m(pcVar18,"disp_lexem_graph");
            if (iVar10 == 0) {
              iVar10 = _preparg_streq_u2m(pcVar18,"disp_char_graph");
              if (iVar10 != 0) {
                uVar17 = true;
                goto LAB_0013cb56;
              }
              iVar10 = _preparg_streq_u2m(pcVar18,"disp_inst_graph");
              if (iVar10 == 0) {
                iVar10 = _preparg_streq_u2m(pcVar18,"disp_inst_pred");
                if (iVar10 != 0) {
                  local_e90 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar10) >> 8),1);
                  goto LAB_0013cb56;
                }
                iVar10 = _preparg_streq_u2m(pcVar18,"disp_trans_freq");
                if (iVar10 != 0) goto LAB_0013cb56;
                iVar10 = _preparg_streq_u2m(pcVar18,"test");
                if (iVar10 != 0) {
                  uVar21 = true;
                  goto LAB_0013cb56;
                }
                iVar10 = _preparg_streq_u2m(pcVar18,"benchmark");
                if (iVar10 != 0) {
                  local_e98 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar10) >> 8),1);
                  goto LAB_0013cb56;
                }
                iVar10 = _preparg_streq_u2m(pcVar18,"boyer_moore");
                if (iVar10 != 0) {
                  bVar5 = true;
                  goto LAB_0013cb56;
                }
                iVar10 = _preparg_streq_u2m(pcVar18,"trace_labels");
                if (iVar10 != 0) {
                  bVar6 = true;
                  goto LAB_0013cb56;
                }
                iVar10 = _preparg_streq_u2m(pcVar18,"no_training");
                if (iVar10 != 0) {
                  bVar7 = true;
                  goto LAB_0013cb56;
                }
                iVar10 = _preparg_streq_u2m(pcVar18,"never_ending");
                if (iVar10 != 0) {
                  bVar8 = true;
                  goto LAB_0013cb56;
                }
                iVar10 = _preparg_streq_u2m(pcVar18,"output");
                if (iVar10 == 0) {
                  iVar10 = _preparg_streq_u2m(pcVar18,"style");
                  if (iVar10 == 0) {
                    iVar10 = _preparg_streq_u2m(pcVar18,"stop_char");
                    if (iVar10 == 0) {
                      iVar10 = _preparg_streq_u2m(pcVar18,"args");
                      if (iVar10 == 0) {
                        iVar10 = _preparg_streq_u2m(pcVar18,"help");
                        uVar16 = extraout_EDX_00;
                        if (iVar10 == 0) goto LAB_0013cb00;
                        goto LAB_0013cf5c;
                      }
                      goto LAB_0013cbc3;
                    }
                    uVar16 = iVar9 + 1;
                    if (uVar22 <= (ulong)(long)(int)uVar16) goto LAB_0013cc3f;
                    bVar4 = _preparg_atoi(&tmp,ppcVar3[uVar16]);
                    if (!bVar4) {
                      local_ee8 = (char **)(ulong)uVar16;
                      goto LAB_0013cc3f;
                    }
                    local_ebc = tmp;
                    iVar9 = 0xf;
                    argv = (char **)(ulong)uVar16;
                    local_ee8 = argv;
                    goto LAB_0013cccf;
                  }
                  goto LAB_0013cd04;
                }
                goto LAB_0013cce6;
              }
              goto LAB_0013cba1;
            }
            goto LAB_0013cb56;
          }
          goto LAB_0013cf74;
        }
        iVar11 = 1;
      }
      goto LAB_0013d632;
    }
    if (pcVar19[2] == '\0') {
joined_r0x0013c508:
      uVar16 = uVar16 + 1;
      if (argc <= (int)uVar16) {
        printf("%s","Error: ");
        putchar(0x61);
        printf("%s"," or --");
        _preparg_dispu("args");
        puts(" must be followed by an argument.\n");
        printf("%s","Try \'");
        pcVar19 = "";
        if (*argv != (char *)0x0) {
          pcVar19 = *argv;
        }
        printf("%s",pcVar19);
        puts(" --help\' for more information.");
        return 0x11;
      }
    }
    goto LAB_0013c4ac;
  }
  if (pcVar19[2] == '\0') {
    uVar16 = uVar16 + 1;
    if ((argc <= (int)uVar16) ||
       (bVar4 = _preparg_atoi(&tmp,argv[(int)uVar16]), uVar22 = extraout_RDX_16, !bVar4))
    goto LAB_0013c5af;
LAB_0013c59c:
    local_ebc = tmp;
    iVar9 = 4;
  }
  else {
    bVar4 = _preparg_atoi(&tmp,pcVar19 + 2);
    uVar22 = extraout_RDX_15;
    if (bVar4) goto LAB_0013c59c;
LAB_0013c5af:
    printf("%s","Error: ");
    putchar(0);
    printf("%s"," or --");
    _preparg_dispu("stop_char");
    puts(" must be followed by an integer.\n");
    printf("%s","Try \'");
    printf("%s");
    puts(" --help\' for more information.");
    iVar9 = 1;
    iVar11 = 0x10;
    uVar22 = extraout_RDX_17;
  }
LAB_0013c63f:
  if (iVar9 != 4) {
    return iVar11;
  }
LAB_0013c4ac:
  local_ee8 = (char **)(ulong)(uVar16 + 1);
  goto LAB_0013c0fa;
LAB_0013cb51:
  if (argv != (char **)0x0) goto LAB_0013cb56;
  if (uVar20 != 0) {
    if (uVar20 == 0x61) {
      if (pcVar19[2] == '\0') {
LAB_0013cbc3:
        local_ee8 = (char **)(ulong)(iVar9 + 1U);
        if (uVar22 <= (ulong)(long)(int)(iVar9 + 1U)) {
          printf("%s","Error: ");
          putchar(0x61);
          printf("%s"," or --");
          _preparg_dispu("args");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar19 = "";
          if (*lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start != (char *)0x0) {
            pcVar19 = *lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          }
          printf("%s",pcVar19);
          puts(" --help\' for more information.");
          iVar11 = 0x11;
          goto LAB_0013d61b;
        }
      }
      goto LAB_0013cb56;
    }
    if (uVar20 == 0x69) {
      if (pcVar19[2] == '\0') {
LAB_0013cba1:
        uVar16 = iVar9 + 1;
        local_ee8 = (char **)(ulong)uVar16;
        if (uVar22 <= (ulong)(long)(int)uVar16) {
          printf("%s","Error: ");
          putchar(0x69);
          printf("%s"," or --");
          _preparg_dispu("disp_inst_graph");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar19 = "";
          if (*lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start != (char *)0x0) {
            pcVar19 = *lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          }
          printf("%s",pcVar19);
          puts(" --help\' for more information.");
          iVar11 = 5;
          goto LAB_0013d61b;
        }
        local_ea8 = ppcVar3[uVar16];
      }
      else {
        local_ea8 = pcVar19 + 2;
      }
      goto LAB_0013cb56;
    }
    if (uVar20 == 0x6f) {
      if (pcVar19[2] == '\0') {
LAB_0013cce6:
        local_ee8 = (char **)(ulong)(iVar9 + 1U);
        if (uVar22 <= (ulong)(long)(int)(iVar9 + 1U)) {
          printf("%s","Error: ");
          putchar(0x6f);
          printf("%s"," or --");
          _preparg_dispu("output");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar19 = "";
          if (*lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start != (char *)0x0) {
            pcVar19 = *lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          }
          printf("%s",pcVar19);
          puts(" --help\' for more information.");
          iVar11 = 0xe;
          goto LAB_0013d61b;
        }
        local_eb8 = ppcVar3[(long)local_ee8];
      }
      else {
        local_eb8 = pcVar19 + 2;
      }
      goto LAB_0013cb56;
    }
    if (uVar20 == 0x73) {
      if (pcVar19[2] == '\0') {
LAB_0013cd04:
        local_ee8 = (char **)(ulong)(iVar9 + 1U);
        if (uVar22 <= (ulong)(long)(int)(iVar9 + 1U)) {
          printf("%s","Error: ");
          putchar(0x73);
          printf("%s"," or --");
          _preparg_dispu("style");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar19 = "";
          if (*lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start != (char *)0x0) {
            pcVar19 = *lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          }
          printf("%s",pcVar19);
          puts(" --help\' for more information.");
          iVar11 = 0xf;
          goto LAB_0013d61b;
        }
        local_eb0 = ppcVar3[(long)local_ee8];
      }
      else {
        local_eb0 = pcVar19 + 2;
      }
      goto LAB_0013cb56;
    }
    if (uVar20 == 0x68) {
LAB_0013cf5c:
      iVar11 = 0;
      usage(*ppcVar3,(char *)0x0,uVar16);
      goto LAB_0013d61b;
    }
LAB_0013cf74:
    Hpipe::CharGraph::CharGraph(&cg,&lexer);
    std::__cxx11::string::string((string *)&tmp,"main",(allocator *)&ig);
    pLVar14 = Hpipe::Lexer::find_machine(&lexer,(string *)&tmp);
    Hpipe::CharGraph::read(&cg,(int)pLVar14,__buf_01,(size_t)argv);
    std::__cxx11::string::~string((string *)&tmp);
    if ((bool)uVar17) {
      Hpipe::CharGraph::display_dot(&cg,".char.dot",(char *)0x0);
    }
    if (cg.ok == true) {
      Hpipe::InstructionGraph::InstructionGraph(&ig);
      iVar11 = strcmp(local_eb0,"C_STR");
      ig.stop_char = -(uint)(iVar11 != 0) | local_ebc;
      ig.no_training = bVar7;
      ig.boyer_moore = bVar5;
      ig.never_ending = bVar8;
      std::__cxx11::string::string((string *)&tmp,local_ea8,(allocator *)&ce);
      std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&tmp,_S_in);
      std::__cxx11::string::~string((string *)&tmp);
      std::
      istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
      ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                          *)local_d20,(istream_type *)&iss);
      local_af0 = (undefined1  [8])0x0;
      local_ae8._M_p = (pointer)&local_ad8;
      local_ae0 = 0;
      local_ad8._M_local_buf[0] = '\0';
      local_ac8 = false;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&disp,
                 (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                  *)local_d20,
                 (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                  *)local_af0,(allocator_type *)&tmp);
      std::__cxx11::string::~string((string *)&local_ae8);
      std::__cxx11::string::~string((string *)(local_d20 + 8));
      __nbytes = (size_t)((byte)local_e90 & 1);
      Hpipe::InstructionGraph::read(&ig,(int)&cg,&disp,__nbytes);
      Hpipe::CppEmitter::CppEmitter(&ce);
      ce.trace_labels = bVar6;
      iVar11 = strcmp(local_eb0,"HPIPE_CB_STRING_PTR");
      if (iVar11 == 0) {
        ce.buffer_type = 0;
        __buf_02 = extraout_RDX_18;
LAB_0013d217:
        Hpipe::CppEmitter::read(&ce,(int)&ig,__buf_02,__nbytes);
        if ((local_e98 & 1) == 0) {
          if ((bool)uVar21) goto LAB_0013d287;
          _tmp = (char *)local_ce0;
          local_ce8 = (pointer)0x0;
          local_ce0[0]._M_local_buf[0] = '\0';
          local_d40._M_dataplus._M_p = (pointer)&local_d40.field_2;
          local_d40._M_string_length = 0;
          local_d40.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string((string *)&local_d60,"\n",&local_e99);
          local_d80._M_dataplus._M_p = (pointer)&local_d80.field_2;
          local_d80._M_string_length = 0;
          local_d80.field_2._M_local_buf[0] = '\0';
          Hpipe::StreamSepMaker::StreamSepMaker
                    (&ss,(TS *)&std::cout,(string *)&tmp,&local_d40,&local_d60,&local_d80);
          std::__cxx11::string::~string((string *)&local_d80);
          std::__cxx11::string::~string((string *)&local_d60);
          std::__cxx11::string::~string((string *)&local_d40);
          std::__cxx11::string::~string((string *)&tmp);
          std::ofstream::ofstream(&tmp);
          if (local_eb8 != (char *)0x0) {
            std::ofstream::open((char *)&tmp,(_Ios_Openmode)local_eb8);
            ss.stream = (TS *)&tmp;
          }
          Hpipe::StreamSepMaker::operator<<
                    (&local_540,&ss,
                     (char (*) [104])
                     "// ----------------------------------------------------------------------------------------------------"
                    );
          Hpipe::StreamSep::~StreamSep(&local_540);
          Hpipe::StreamSepMaker::operator<<
                    (&local_588,&ss,(char (*) [27])"#ifdef HPIPE_PRELIMINARIES");
          Hpipe::StreamSep::~StreamSep(&local_588);
          Hpipe::CppEmitter::write_preliminaries(&ce,&ss);
          Hpipe::StreamSepMaker::operator<<
                    (&local_5d0,&ss,(char (*) [30])"#endif // HPIPE_PRELIMINARIES");
          Hpipe::StreamSep::~StreamSep(&local_5d0);
          Hpipe::StreamSepMaker::operator<<(&local_618,&ss,(char (*) [1])0x1760d4);
          Hpipe::StreamSep::~StreamSep(&local_618);
          Hpipe::StreamSepMaker::operator<<
                    (&local_660,&ss,
                     (char (*) [104])
                     "// ----------------------------------------------------------------------------------------------------"
                    );
          Hpipe::StreamSep::~StreamSep(&local_660);
          Hpipe::StreamSepMaker::operator<<
                    (&local_6a8,&ss,(char (*) [26])"#ifdef HPIPE_DECLARATIONS");
          Hpipe::StreamSep::~StreamSep(&local_6a8);
          Hpipe::CppEmitter::write_declarations(&ce,&ss);
          Hpipe::StreamSepMaker::operator<<
                    (&local_6f0,&ss,(char (*) [29])"#endif // HPIPE_DECLARATIONS");
          Hpipe::StreamSep::~StreamSep(&local_6f0);
          Hpipe::StreamSepMaker::operator<<(&local_738,&ss,(char (*) [1])0x1760d4);
          Hpipe::StreamSep::~StreamSep(&local_738);
          Hpipe::StreamSepMaker::operator<<
                    (&local_780,&ss,
                     (char (*) [104])
                     "// ----------------------------------------------------------------------------------------------------"
                    );
          Hpipe::StreamSep::~StreamSep(&local_780);
          Hpipe::StreamSepMaker::operator<<
                    (&local_7c8,&ss,(char (*) [25])"#ifdef HPIPE_DEFINITIONS");
          Hpipe::StreamSep::~StreamSep(&local_7c8);
          Hpipe::CppEmitter::write_definitions(&ce,&ss);
          Hpipe::StreamSepMaker::operator<<
                    (&local_810,&ss,(char (*) [28])"#endif // HPIPE_DEFINITIONS");
          Hpipe::StreamSep::~StreamSep(&local_810);
          std::ofstream::~ofstream(&tmp);
          Hpipe::StreamSepMaker::~StreamSepMaker(&ss);
          iVar11 = 0;
        }
        else {
          Hpipe::Lexer::training_data((Vec<Hpipe::Lexer::TrainingData> *)&tmp,&lexer);
          Hpipe::CppEmitter::bench
                    (&ce,(vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                          *)&tmp);
          std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::
          ~vector((vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *
                  )&tmp);
          iVar11 = 0;
          if ((bool)uVar21) {
LAB_0013d287:
            Hpipe::Lexer::test_data((Vec<Hpipe::Lexer::TestData> *)&tmp,&lexer);
            iVar11 = Hpipe::CppEmitter::test
                               (&ce,(vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_>
                                     *)&tmp);
            std::vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_>::~vector
                      ((vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_> *)
                       &tmp);
          }
        }
      }
      else {
        iVar11 = strcmp(local_eb0,"HPIPE_BUFFER");
        if (iVar11 == 0) {
          ce.buffer_type = 1;
          __buf_02 = extraout_RDX_19;
          goto LAB_0013d217;
        }
        iVar11 = strcmp(local_eb0,"BEG_END");
        if (iVar11 == 0) {
          ce.buffer_type = 2;
          __buf_02 = extraout_RDX_20;
          goto LAB_0013d217;
        }
        iVar11 = strcmp(local_eb0,"C_STR");
        if (iVar11 == 0) {
          ce.buffer_type = 3;
          __buf_02 = extraout_RDX_21;
          goto LAB_0013d217;
        }
        poVar15 = std::operator<<((ostream *)&std::cerr,"Unknown parse style ( ");
        poVar15 = std::operator<<(poVar15,local_eb0);
        poVar15 = std::operator<<(poVar15," ). Possible values are HPIPE_BUFFER, BEG_END or C_STR");
        std::endl<char,std::char_traits<char>>(poVar15);
        iVar11 = 1;
      }
      Hpipe::CppEmitter::~CppEmitter(&ce);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&disp);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      Hpipe::InstructionGraph::~InstructionGraph(&ig);
    }
    else {
      iVar11 = 1;
    }
    Hpipe::CharGraph::~CharGraph(&cg);
LAB_0013d61b:
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&lfc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lfs.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
LAB_0013d632:
    Hpipe::Lexer::~Lexer(&lexer);
    Hpipe::Pool<Hpipe::Source,_32>::~Pool(&source_pool);
    Hpipe::StreamSepMaker::~StreamSepMaker(&error_list.out);
    return iVar11;
  }
  if (pcVar19[2] == '\0') {
    uVar16 = iVar9 + 1;
    local_ee8 = (char **)(ulong)uVar16;
    if ((ulong)(long)(int)uVar16 < uVar22) {
      pcVar19 = ppcVar3[uVar16];
      goto LAB_0013cc23;
    }
LAB_0013cc3f:
    printf("%s","Error: ");
    putchar(0);
    printf("%s"," or --");
    _preparg_dispu("stop_char");
    puts(" must be followed by an integer.\n");
    printf("%s","Try \'");
    pcVar19 = *lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (pcVar19 == (char *)0x0) {
      pcVar19 = "";
    }
    printf("%s",pcVar19);
    puts(" --help\' for more information.");
    iVar9 = 1;
    argv = (char **)0x10;
    iVar11 = 0x10;
  }
  else {
    pcVar19 = pcVar19 + 2;
LAB_0013cc23:
    bVar4 = _preparg_atoi(&tmp,pcVar19);
    if (!bVar4) goto LAB_0013cc3f;
    local_ebc = tmp;
    iVar9 = 0xf;
  }
LAB_0013cccf:
  if (iVar9 != 0xf) goto LAB_0013d61b;
LAB_0013cb56:
  local_ee8 = (char **)(ulong)((int)local_ee8 + 1);
  goto LAB_0013c872;
}

Assistant:

int main( int argc, char **argv ) {
    // args
    #include <PrepArg/declarations.h>
    #include <PrepArg/parse.h>
    if ( beg_files < 0 )
        return usage( argv[ 0 ], "Please specify one or several input file", 2 );

    try {
        // lexems
        ErrorList error_list;
        Pool<Source> source_pool;
        Lexer lexer( error_list, source_pool );
        if ( not disp_lexem_graph )
            lexer.read( source_pool.New( "src/Hpipe/predef.sipe", predef, false ) );
        for( int i = beg_files; i < argc; ++i )
            lexer.read( source_pool.New( argv[ i ] ) );
        if ( disp_lexem_graph ) {
            lexer.root()->display_dot();
            return 0;
        }
        if ( ! error_list )
            return 1;

        // update flags
        Vec<std::string> lfs = lexer.flags();
        Vec<const char *> lfc;
        lfc << "beg_flags section";
        for( std::string &str : lfs )
            lfc << str.c_str();
        #undef PREPARG_ARGV
        #undef PREPARG_ARGC
        #define PREPARG_ARGC lfc.size()
        #define PREPARG_ARGV lfc
        #include <PrepArg/parse.h>

        // char and transitions
        CharGraph cg( lexer );
        cg.read( lexer.find_machine( "main" ) );
        if ( disp_char_graph )
            cg.display_dot();
        if ( ! cg.ok )
            return 1;

        // instruction graph
        InstructionGraph ig;
        ig.stop_char    = strcmp( style, "C_STR" ) == 0 ? stop_char : -1;
        ig.boyer_moore  = boyer_moore;
        ig.no_training  = no_training;
        ig.never_ending = never_ending;

        std::istringstream iss( disp_inst_graph );
        std::vector<std::string> disp( std::istream_iterator<std::string>{ iss }, std::istream_iterator<std::string>{} );
        ig.read( &cg, disp, disp_inst_pred, disp_trans_freq );

        // emitter
        CppEmitter ce;
        ce.trace_labels = trace_labels;

        if      ( strcmp( style, "HPIPE_CB_STRING_PTR" ) == 0 ) { ce.buffer_type = CppEmitter::BT_HPIPE_CB_STRING_PTR; }
        else if ( strcmp( style, "HPIPE_BUFFER"        ) == 0 ) { ce.buffer_type = CppEmitter::BT_HPIPE_BUFFER       ; }
        else if ( strcmp( style, "BEG_END"             ) == 0 ) { ce.buffer_type = CppEmitter::BT_BEG_END            ; }
        else if ( strcmp( style, "C_STR"               ) == 0 ) { ce.buffer_type = CppEmitter::BT_C_STR              ; }
        else { std::cerr << "Unknown parse style ( " << style << " ). Possible values are HPIPE_BUFFER, BEG_END or C_STR" << std::endl; return 1; }

        ce.read( &ig );

        // output/test
        if ( benchmark )
            ce.bench( lexer.training_data() );

        if ( test )
            return ce.test( lexer.test_data() );

        if ( benchmark )
            return 0;

        StreamSepMaker ss( std::cout );
        std::ofstream fout;
        if ( output ) {
            fout.open( output );
            ss.stream = &fout;
        }

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_PRELIMINARIES";
        ce.write_preliminaries( ss );
        ss << "#endif // HPIPE_PRELIMINARIES";
        ss << "";

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_DECLARATIONS";
        ce.write_declarations( ss );
        ss << "#endif // HPIPE_DECLARATIONS";
        ss << "";

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_DEFINITIONS";
        ce.write_definitions( ss );
        ss << "#endif // HPIPE_DEFINITIONS";

        return 0;
    } catch ( const char *msg ) {
        std::cerr << msg << std::endl;
        return 1;
    }
}